

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void doctest::detail::logAssert
               (bool passed,char *decomposition,bool threw,char *expr,Enum assert_type,char *file,
               int line)

{
  char *pcVar1;
  Code code;
  undefined7 in_register_00000039;
  Color *pCVar2;
  char msg [1024];
  char info3 [1024];
  char info2 [1024];
  char info1 [1024];
  char loc [1024];
  String local_1490;
  String local_1488;
  String local_1480;
  String local_1478;
  String local_1470;
  String local_1468;
  String local_1460;
  String local_1458;
  String local_1450;
  String local_1448;
  String local_1440;
  char local_1438 [1024];
  Color local_1038 [1024];
  uint local_c38;
  char acStack_c34 [1020];
  Color local_838 [1024];
  char local_438 [1032];
  
  pcVar1 = fileForOutput(file);
  snprintf(local_438,0x400,"%s(%d)",pcVar1,(ulong)(uint)line);
  if ((int)CONCAT71(in_register_00000039,passed) == 0) {
    pcVar1 = "";
    if (threw) {
      pcVar1 = "(threw exception)";
    }
    snprintf(local_1438,0x400," FAILED! %s\n",pcVar1);
  }
  else {
    builtin_strncpy(local_1438," PASSED!\n",10);
  }
  pcVar1 = getAssertString(assert_type);
  pCVar2 = local_838;
  snprintf((char *)pCVar2,0x400,"  %s( %s )\n",pcVar1,expr);
  local_c38 = local_c38 & 0xffffff00;
  local_1038[0] = (Color)0x0;
  if (!threw) {
    local_c38._0_1_ = 'w';
    local_c38._1_1_ = 'i';
    local_c38._2_1_ = 't';
    local_c38._3_1_ = 'h';
    builtin_strncpy(acStack_c34," expansion:\n",0xd);
    pCVar2 = local_1038;
    snprintf((char *)pCVar2,0x400,"  %s( %s )\n",pcVar1,decomposition);
  }
  if (local_438[0] != '\0') {
    Color::use(pCVar2,LightGrey);
    pCVar2 = (Color *)0x14a3de;
    printf("%s");
    Color::use(pCVar2,None);
  }
  if (local_1438[0] != '\0') {
    code = Red;
    if (passed) {
      code = BrightGreen;
    }
    Color::use(pCVar2,code);
    pCVar2 = (Color *)0x14a3de;
    printf("%s");
    Color::use(pCVar2,None);
  }
  if (local_838[0] != (Color)0x0) {
    Color::use(pCVar2,Cyan);
    pCVar2 = (Color *)0x14a3de;
    printf("%s");
    Color::use(pCVar2,None);
  }
  if (!threw) {
    Color::use(pCVar2,None);
    pCVar2 = (Color *)0x14a3de;
    printf("%s");
    Color::use(pCVar2,None);
  }
  if (local_1038[0] != (Color)0x0) {
    Color::use(pCVar2,Cyan);
    pCVar2 = (Color *)0x14a3de;
    printf("%s");
    Color::use(pCVar2,None);
  }
  Color::use(pCVar2,None);
  pCVar2 = (Color *)0xa;
  putchar(10);
  Color::use(pCVar2,None);
  String::String(&local_1480,local_438);
  String::String(&local_1488,local_1438);
  String::operator+(&local_1478,&local_1480);
  String::String(&local_1490,(char *)local_838);
  String::operator+(&local_1470,&local_1478);
  String::String(&local_1458,(char *)&local_c38);
  String::operator+(&local_1450,&local_1470);
  String::String(&local_1460,(char *)local_1038);
  String::operator+(&local_1448,&local_1450);
  String::String(&local_1468,"\n");
  String::operator+(&local_1440,&local_1448);
  free(local_1440.m_str);
  free(local_1468.m_str);
  free(local_1448.m_str);
  free(local_1460.m_str);
  free(local_1450.m_str);
  free(local_1458.m_str);
  free(local_1470.m_str);
  free(local_1490.m_str);
  free(local_1478.m_str);
  free(local_1488.m_str);
  free(local_1480.m_str);
  return;
}

Assistant:

void logAssert(bool passed, const char* decomposition, bool threw, const char* expr,
                   assertType::Enum assert_type, const char* file, int line) {
        char loc[DOCTEST_SNPRINTF_BUFFER_LENGTH];
        DOCTEST_SNPRINTF(loc, DOCTEST_COUNTOF(loc), "%s(%d)", fileForOutput(file), line);

        char msg[DOCTEST_SNPRINTF_BUFFER_LENGTH];
        if(passed)
            DOCTEST_SNPRINTF(msg, DOCTEST_COUNTOF(msg), " PASSED!\n");
        else
            DOCTEST_SNPRINTF(msg, DOCTEST_COUNTOF(msg), " FAILED! %s\n",
                             (threw ? "(threw exception)" : ""));

        char info1[DOCTEST_SNPRINTF_BUFFER_LENGTH];
        DOCTEST_SNPRINTF(info1, DOCTEST_COUNTOF(info1), "  %s( %s )\n",
                         getAssertString(assert_type), expr);

        char info2[DOCTEST_SNPRINTF_BUFFER_LENGTH];
        char info3[DOCTEST_SNPRINTF_BUFFER_LENGTH];
        info2[0] = 0;
        info3[0] = 0;
        if(!threw) {
            DOCTEST_SNPRINTF(info2, DOCTEST_COUNTOF(info2), "with expansion:\n");
            DOCTEST_SNPRINTF(info3, DOCTEST_COUNTOF(info3), "  %s( %s )\n",
                             getAssertString(assert_type), decomposition);
        }

        DOCTEST_PRINTF_COLORED(loc, Color::LightGrey);
        DOCTEST_PRINTF_COLORED(msg, passed ? Color::BrightGreen : Color::Red);
        DOCTEST_PRINTF_COLORED(info1, Color::Cyan);
        DOCTEST_PRINTF_COLORED(info2, Color::None);
        DOCTEST_PRINTF_COLORED(info3, Color::Cyan);
        DOCTEST_PRINTF_COLORED("\n", Color::None);

        printToDebugConsole(String(loc) + msg + info1 + info2 + info3 + "\n");
    }